

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O2

sc_string_old __thiscall sc_dt::sc_string_old::operator+(sc_string_old *this,char *s)

{
  int iVar1;
  sc_string_rep *this_00;
  size_t sVar2;
  char *in_RDX;
  
  iVar1 = length((sc_string_old *)s);
  this_00 = (sc_string_rep *)operator_new(0x10);
  sVar2 = strlen(in_RDX);
  sc_string_rep::sc_string_rep(this_00,(int)sVar2 + iVar1 + 1);
  strcpy(this_00->str,*(char **)(*(long *)s + 8));
  strcpy(this_00->str + iVar1,in_RDX);
  sc_string_old(this,this_00);
  return (sc_string_old)(sc_string_rep *)this;
}

Assistant:

sc_string_old
sc_string_old::operator+( const char* s ) const
{
    int len = length();
    sc_string_rep* r = new sc_string_rep( len + strlen(s) + 1 );
    strcpy( r->str, rep->str );
    strcpy( r->str + len, s );
    return sc_string_old(r);
}